

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_get_bit(stbi__jpeg *j)

{
  uint uVar1;
  
  if (j->code_bits < 1) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar1 = j->code_buffer;
  j->code_buffer = uVar1 * 2;
  j->code_bits = j->code_bits + -1;
  return uVar1 & 0x80000000;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bit(stbi__jpeg *j)
{
   unsigned int k;
   if (j->code_bits < 1) stbi__grow_buffer_unsafe(j);
   k = j->code_buffer;
   j->code_buffer <<= 1;
   --j->code_bits;
   return k & 0x80000000;
}